

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O2

void Saig_ManPrintConeOne(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *p_00;
  void *Entry;
  ulong uVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Vec_Ptr_t *p_01;
  uint local_48;
  int local_44;
  Vec_Ptr_t *local_40;
  
  if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
    pAVar7 = pObj;
    iVar1 = Aig_ObjCioId(pObj);
    if (iVar1 < p->nTruePos) {
      local_40 = Vec_PtrAlloc((int)pAVar7);
      Vec_PtrPush(local_40,pObj);
      pVVar5 = Saig_ManSupport(p,local_40);
      local_40->nSize = 0;
      uVar2 = Aig_ObjCioId(pObj);
      iVar1 = 0x843dd9;
      printf("    PO %3d  ",(ulong)uVar2);
      p_00 = Vec_PtrAlloc(iVar1);
      local_48 = 0;
      while( true ) {
        p_01 = pVVar5;
        iVar1 = 0;
        uVar8 = 0;
        uVar6 = 0;
        local_44 = 0;
        while( true ) {
          uVar2 = p_01->nSize;
          iVar4 = (int)uVar8;
          if ((int)uVar2 <= iVar1) break;
          Entry = Vec_PtrEntry(p_01,iVar1);
          iVar3 = Vec_PtrFind(p_00,Entry);
          if (iVar3 == -1) {
            Vec_PtrPush(p_00,Entry);
            uVar8 = (ulong)(iVar4 + 1);
          }
          else {
            iVar4 = Vec_PtrFind(local_40,Entry);
            if (iVar4 < 0) {
              local_44 = local_44 + 1;
            }
            else {
              uVar6 = (ulong)((int)uVar6 + 1);
            }
          }
          iVar1 = iVar1 + 1;
        }
        if ((int)uVar6 + iVar4 + local_44 != uVar2) break;
        printf("%d:%d %d=%d+%d+%d  ",(ulong)local_48,(ulong)(uint)p_00->nSize,(ulong)uVar2,uVar8,
               uVar6,local_44);
        if (iVar4 == 0) {
          putchar(10);
          Vec_PtrFree(local_40);
          Vec_PtrFree(p_01);
          Vec_PtrFree(p_00);
          return;
        }
        Vec_PtrFree(local_40);
        pVVar5 = Saig_ManSupport(p,p_01);
        local_48 = local_48 + 1;
        local_40 = p_01;
      }
      __assert_fail("nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigCone.c"
                    ,0x85,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
    }
  }
  __assert_fail("Saig_ObjIsPo(p, pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigCone.c"
                ,0x6b,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Saig_ManPrintConeOne( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vPrev, * vCur, * vTotal;
    int s, i, nCurNew, nCurPrev, nCurOld;
    assert( Saig_ObjIsPo(p, pObj) );
    // start the array
    vPrev = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vPrev, pObj );
    // get the current support
    vCur = Saig_ManSupport( p, vPrev );  
    Vec_PtrClear( vPrev );
    printf( "    PO %3d  ", Aig_ObjCioId(pObj) );
    // continue computing supports as long as there are now nodes
    vTotal = Vec_PtrAlloc( 100 );
    for ( s = 0; ; s++ )
    {
        // classify current into those new, prev, and older 
        nCurNew = nCurPrev = nCurOld = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vCur, pObj, i )
        {
            if ( Vec_PtrFind(vTotal, pObj) == -1 )
            {
                Vec_PtrPush( vTotal, pObj );
                nCurNew++;
            }
            else if ( Vec_PtrFind(vPrev, pObj) >= 0 )
                nCurPrev++;
            else
                nCurOld++;
        }
        assert( nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur) );
        // print the result
        printf( "%d:%d %d=%d+%d+%d  ", s, Vec_PtrSize(vTotal), Vec_PtrSize(vCur), nCurNew, nCurPrev, nCurOld ); 
        if ( nCurNew == 0 )
            break;
        // compute one more step
        Vec_PtrFree( vPrev );
        vCur = Saig_ManSupport( p, vPrev = vCur );
    }
    printf( "\n" );
    Vec_PtrFree( vPrev );
    Vec_PtrFree( vCur );
    Vec_PtrFree( vTotal );
}